

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_case(CTcParser *this,int *err,CTPNStmSwitch *enclosing_switch)

{
  CTPNStmCase *this_00;
  CTcPrsNode *pCVar1;
  CTPNStm *pCVar2;
  int *piVar3;
  
  piVar3 = err;
  CTcTokenizer::next(G_tok);
  this_00 = (CTPNStmCase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)piVar3);
  CTPNStmCase::CTPNStmCase(this_00);
  pCVar1 = parse_expr(this);
  if (pCVar1 == (CTcPrsNode *)0x0) {
    *err = 1;
    this_00 = (CTPNStmCase *)0x0;
  }
  else {
    (this_00->super_CTPNStmCaseBase).expr_ = pCVar1;
    if ((G_tok->curtok_).typ_ == TOKT_COLON) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b4b);
    }
    pCVar2 = parse_stm(this,err,enclosing_switch,0);
    (this_00->super_CTPNStmCaseBase).stm_ = pCVar2;
    piVar3 = &(enclosing_switch->super_CTPNStmSwitchBase).case_cnt_;
    *piVar3 = *piVar3 + 1;
  }
  return (CTPNStm *)this_00;
}

Assistant:

CTPNStm *CTcParser::parse_case(int *err, CTPNStmSwitch *enclosing_switch)
{
    CTcPrsNode *expr;
    CTPNStm *stm;
    CTPNStmCase *case_stm;
    
    /* skip the 'case' keyword */
    G_tok->next();

    /* create the 'case' statement node */
    case_stm = new CTPNStmCase();

    /* parse the expression */
    expr = parse_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* store the expression in the case statement node */
    case_stm->set_expr(expr);

    /* require the colon */
    if (G_tok->cur() == TOKT_COLON)
    {
        /* skip the colon */
        G_tok->next();
    }
    else
    {
        /* log the error */
        G_tok->log_error_curtok(TCERR_REQ_CASE_COLON);
    }

    /* 
     *   parse the labeled statement - it's directly within this same
     *   enclosing switch, because a case label doesn't create a new
     *   expression nesting level (hence another 'case' label immediately
     *   following without an intervening statement is perfectly valid) 
     */
    stm = parse_stm(err, enclosing_switch, FALSE);

    /* set the statement in the case node */
    case_stm->set_stm(stm);

    /* count the 'case' label in the 'switch' node */
    enclosing_switch->inc_case_cnt();

    /* return the case node */
    return case_stm;
}